

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O1

uint8_t * __thiscall
proto3_unittest::TestMessageWithDummy::_InternalSerialize
          (TestMessageWithDummy *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  uint8_t *puVar4;
  uint uVar5;
  
  if (((undefined1  [12])((undefined1  [12])this->field_0 & (undefined1  [12])0x1) !=
       (undefined1  [12])0x0) && ((this->field_0)._impl_.dummy_ == true)) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.dummy_;
    target = target + 2;
    uVar5 = 0xfffffff8;
    do {
      puVar4 = target;
      puVar4[-2] = (byte)uVar5 | 0x80;
      target = puVar4 + 1;
      bVar3 = 0x3fff < uVar5;
      uVar5 = uVar5 >> 7;
    } while (bVar3);
    puVar4[-1] = '\x0f';
    *puVar4 = bVar1;
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar4 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar4;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestMessageWithDummy::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestMessageWithDummy& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto3_unittest.TestMessageWithDummy)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // bool dummy = 536870911;
  if ((this_._impl_._has_bits_[0] & 0x00000001u) != 0) {
    if (this_._internal_dummy() != 0) {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteBoolToArray(
          536870911, this_._internal_dummy(), target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto3_unittest.TestMessageWithDummy)
  return target;
}